

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emissive.cpp
# Opt level: O1

RGBColor __thiscall pm::Emissive::globalShade(Emissive *this,ShadeRecord *sr)

{
  undefined4 *in_RDI;
  ulong uVar1;
  float fVar2;
  float fVar3;
  RGBColor RVar4;
  
  uVar1 = 0;
  fVar3 = 0.0;
  fVar2 = 0.0;
  if (sr->depth != 1) {
    uVar1 = 0;
    fVar3 = 0.0;
    fVar2 = 0.0;
    if (0.0 < (-(sr->normal).x * (sr->ray).d.x - (sr->ray).d.y * (sr->normal).y) -
              (sr->normal).z * (sr->ray).d.z) {
      fVar2 = *(float *)&(this->super_Material).field_0xc;
      uVar1 = (ulong)(uint)((this->ce_).r * fVar2);
      fVar3 = (this->ce_).g * fVar2;
      fVar2 = fVar2 * (this->ce_).b;
    }
  }
  *in_RDI = (int)uVar1;
  in_RDI[1] = fVar3;
  in_RDI[2] = fVar2;
  RVar4.b = fVar2;
  RVar4.r = (float)(int)uVar1;
  RVar4.g = (float)(int)(uVar1 >> 0x20);
  return RVar4;
}

Assistant:

RGBColor Emissive::globalShade(ShadeRecord &sr) const
{
	if (sr.depth == 1)
		return RGBColor(0.0f, 0.0f, 0.0f);

	if (dot(-sr.normal, sr.ray.d) > 0.0)
		return (ls_ * ce_);
	else
		return RGBColor(0.0f, 0.0f, 0.0f);
}